

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O1

Integer ma_table_allocate(TableData data)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Integer IVar4;
  Integer IVar5;
  Table pTVar6;
  Table __dest;
  long lVar7;
  long lVar8;
  TableEntryState *pTVar9;
  ulong uVar10;
  long lVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  IVar5 = ma_table_capacity;
  IVar4 = ma_table_entries;
  if (ma_table_capacity <= ma_table_entries) {
    lVar11 = 0x20;
    if (ma_table_capacity != 0) {
      lVar11 = ma_table_capacity * 2;
    }
    uVar10 = (ulong)(uint)((int)lVar11 << 4);
    __dest = (Table)malloc(uVar10);
    pTVar6 = ma_table;
    if (__dest == (Table)0x0) {
      sprintf(ma_ebuf,"could not allocate %u bytes for ma_table",uVar10);
      goto LAB_0010d919;
    }
    if (0 < IVar5) {
      memcpy(__dest,ma_table,(long)((int)IVar5 << 4));
      free(pTVar6);
    }
    auVar3 = _DAT_00111840;
    auVar2 = _DAT_00111830;
    auVar1 = _DAT_0010fc30;
    lVar7 = lVar11 - IVar5;
    if (lVar7 != 0 && IVar5 <= lVar11) {
      lVar8 = lVar7 + -1;
      auVar12._8_4_ = (int)lVar8;
      auVar12._0_8_ = lVar8;
      auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
      pTVar9 = &__dest[lVar11 + -1].state;
      uVar10 = 0;
      auVar12 = auVar12 ^ _DAT_0010fc30;
      do {
        auVar14._8_4_ = (int)uVar10;
        auVar14._0_8_ = uVar10;
        auVar14._12_4_ = (int)(uVar10 >> 0x20);
        auVar15 = (auVar14 | auVar3) ^ auVar1;
        iVar13 = auVar12._4_4_;
        if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                    iVar13 < auVar15._4_4_) & 1)) {
          *pTVar9 = TES_Unused;
        }
        if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
            auVar15._12_4_ <= auVar12._12_4_) {
          pTVar9[-4] = 0;
        }
        auVar14 = (auVar14 | auVar2) ^ auVar1;
        iVar16 = auVar14._4_4_;
        if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
          pTVar9[-8] = 0;
          pTVar9[-0xc] = 0;
        }
        uVar10 = uVar10 + 4;
        pTVar9 = pTVar9 + -0x10;
      } while ((lVar7 + 3U & 0xfffffffffffffffc) != uVar10);
    }
    ma_table_next_slot = IVar5;
    ma_table_capacity = lVar11;
    ma_table = __dest;
  }
  pTVar6 = ma_table;
  IVar5 = ma_table_capacity;
  lVar11 = ma_table_next_slot;
  lVar7 = ma_table_capacity;
  if (0 < ma_table_capacity) {
    do {
      if (ma_table[lVar11].state != TES_Allocated) {
        ma_table[lVar11].data = data;
        pTVar6[lVar11].state = TES_Allocated;
        ma_table_entries = IVar4 + 1;
        ma_table_next_slot = (lVar11 + 1) % IVar5;
        return lVar11;
      }
      lVar7 = lVar7 + -1;
      lVar11 = (lVar11 + 1) % ma_table_capacity;
    } while (lVar7 != 0);
  }
  sprintf(ma_ebuf,"no ma_table slot available, %ld/%ld slots used",IVar4);
LAB_0010d919:
  ma_error(EL_Nonfatal,ET_Internal,"ma_table_allocate",ma_ebuf);
  return -1;
}

Assistant:

public Integer ma_table_allocate(data)
    TableData    data;        /* to store */
{
    Table    new_ma_table;
    Integer    new_ma_table_capacity;
    unsigned    new_ma_table_size;
    Integer    i;
    Integer    slots_examined;

    /* expand the table if necessary */
    if (ma_table_entries >= ma_table_capacity)
    {
        /* increase table capacity */
        if (ma_table_capacity == 0)
            /* set the initial capacity */
            new_ma_table_capacity = DEFAULT_TABLE_ENTRIES;
        else
            /* double the current capacity */
            new_ma_table_capacity = 2 * ma_table_capacity;

        /* allocate space for new table */
        new_ma_table_size = (unsigned)(new_ma_table_capacity * sizeof(TableEntry));
        if ((new_ma_table = (Table)bytealloc(new_ma_table_size)) == (Table)NULL)
        {
            (void)sprintf(ma_ebuf,
                "could not allocate %u bytes for ma_table",
                new_ma_table_size);
            ma_error(EL_Nonfatal, ET_Internal, "ma_table_allocate", ma_ebuf);
            return TABLE_HANDLE_NONE;
        }

        /* copy and free old table */
        if (ma_table_capacity > 0)
        {
            bytecopy(ma_table, new_ma_table, (ma_table_capacity * sizeof(TableEntry)));
            bytefree(ma_table);
        }

        /* initialize new part of new table */
        for (i = new_ma_table_capacity-1; i >= ma_table_capacity; i--)
            new_ma_table[i].state = TES_Unused;

        /* remember the new table */
        ma_table = new_ma_table;
        ma_table_next_slot = ma_table_capacity;
        ma_table_capacity = new_ma_table_capacity;
    }

    /* perform a linear circular search to find the next available slot */
    for (slots_examined = 0, i = ma_table_next_slot;
         slots_examined < ma_table_capacity;
         slots_examined++, i = (i+1) % ma_table_capacity)
    {
        if (ma_table[i].state != TES_Allocated)
        {
            /* store the data */
            ma_table[i].data = data;
            ma_table[i].state = TES_Allocated;

            /* increment ma_table_entries */
            ma_table_entries++;

            /* advance ma_table_next_slot */
            ma_table_next_slot = (i+1) % ma_table_capacity;

            /* return the handle */
            return i;
        }
    }

    /* if we get here, something is wrong */
    (void)sprintf(ma_ebuf,
        "no ma_table slot available, %ld/%ld slots used",
        (long)ma_table_entries, (long)ma_table_capacity);
    ma_error(EL_Nonfatal, ET_Internal, "ma_table_allocate", ma_ebuf);
    return TABLE_HANDLE_NONE;
}